

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O2

void character_bed_vischar(tgestate_t *state,route_t *route)

{
  byte bVar1;
  routeindex_t rVar2;
  
  bVar1 = state->IY->character;
  if (bVar1 != 0) {
    route->step = '\0';
    if (bVar1 < 0x14) {
      rVar2 = '\r';
      if ((bVar1 & 1) != 0) {
        route->step = '\x01';
        rVar2 = 0x8d;
      }
    }
    else {
      rVar2 = bVar1 - 0xd;
    }
    route->index = rVar2;
    return;
  }
  set_hero_route(state,&character_bed_vischar::t);
  return;
}

Assistant:

void character_bed_vischar(tgestate_t *state, route_t *route)
{
  character_t character;
  vischar_t  *vischar;

  assert(state != NULL);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  vischar = state->IY;
  ASSERT_VISCHAR_VALID(vischar);

  character = vischar->character;
  if (character == character_0_COMMANDANT)
  {
    // Hero moves to bed in reaction to the commandant...

    static const route_t t = { routeindex_44_HUT2_RIGHT_TO_LEFT, 0 }; /* was BC */
    set_hero_route(state, &t);
  }
  else
  {
    character_bed_common(state, character, route); /* was fallthrough */
  }
}